

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.cpp
# Opt level: O2

string * __thiscall pbrt::TexInfo::ToString_abi_cxx11_(string *__return_storage_ptr__,TexInfo *this)

{
  ColorEncodingHandle *unaff_RBX;
  
  StringPrintf<std::__cxx11::string_const&,pbrt::MIPMapFilterOptions_const&,pbrt::WrapMode_const&,pbrt::ColorEncodingHandle_const&>
            (__return_storage_ptr__,
             (pbrt *)"[ TexInfo filename: %s filterOptions: %s wrapMode: %s encoding: %s ]",
             (char *)this,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &this->filterOptions,(MIPMapFilterOptions *)&this->wrapMode,(WrapMode *)&this->encoding
             ,unaff_RBX);
  return __return_storage_ptr__;
}

Assistant:

std::string TexInfo::ToString() const {
    return StringPrintf(
        "[ TexInfo filename: %s filterOptions: %s wrapMode: %s encoding: %s ]", filename,
        filterOptions, wrapMode, encoding);
}